

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int32_suite::fail_array16_int32_invalid_length(void)

{
  value_type input [11];
  decoder decoder;
  undefined4 local_48;
  value local_44;
  uchar local_40 [16];
  decoder local_30;
  
  local_30.input._M_str = local_40;
  local_40[0] = 0xbc;
  local_40[1] = '\a';
  local_40[2] = '\0';
  local_40[3] = '\x11';
  local_40[4] = '\"';
  local_40[5] = '3';
  local_40[6] = 'D';
  local_40[7] = 'U';
  local_40[8] = 'f';
  local_40[9] = 'w';
  local_40[10] = 0x88;
  local_30.input._M_len = 0xb;
  local_30.current.view._M_len = 0;
  local_30.current.view._M_str = (uchar *)0x0;
  local_30.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_30);
  local_44 = local_30.current.code;
  local_48 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::error_invalid_length",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x921,"void compact_int32_suite::fail_array16_int32_invalid_length()",&local_44,
             &local_48);
  return;
}

Assistant:

void fail_array16_int32_invalid_length()
{
    const value_type input[] = { token::code::array16_int32, 0x07, 0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_invalid_length);
}